

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::SectionInfo::SectionInfo(SectionInfo *this,SourceLineInfo *_lineInfo,string *_name)

{
  string *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x40) = *in_RSI;
  *(undefined8 *)(in_RDI + 0x48) = in_RSI[1];
  return;
}

Assistant:

SectionInfo::SectionInfo
        (   SourceLineInfo const& _lineInfo,
            std::string const& _name )
    :   name( _name ),
        lineInfo( _lineInfo )
    {}